

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_value * mg_map_at(mg_map *map,char *key_str)

{
  size_t sVar1;
  mg_map *in_RSI;
  size_t key_size;
  char *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  sVar1 = strlen((char *)in_RSI);
  if (sVar1 < 0xffffffff) {
    local_8 = mg_map_at2(in_RSI,(uint32_t)(sVar1 >> 0x20),in_stack_ffffffffffffffd8);
  }
  else {
    local_8 = (mg_value *)0x0;
  }
  return local_8;
}

Assistant:

const mg_value *mg_map_at(const mg_map *map, const char *key_str) {
  size_t key_size = strlen(key_str);
  if (key_size >= UINT32_MAX) {
    return NULL;
  }
  return mg_map_at2(map, (uint32_t)key_size, key_str);
}